

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O1

REF_STATUS
ref_metric_cons_assembly
          (REF_DBL *metric,REF_DBL *g,REF_GRID ref_grid,REF_INT ldim,REF_DBL *prim_dual,
          REF_RECON_RECONSTRUCTION reconstruction)

{
  double dVar1;
  double dVar2;
  REF_NODE pRVar3;
  REF_GLOB *pRVar4;
  bool bVar5;
  uint uVar6;
  REF_DBL *hessian;
  ulong uVar7;
  undefined8 uVar8;
  int iVar9;
  size_t __size;
  undefined8 unaff_RBP;
  long lVar10;
  REF_DBL *pRVar11;
  REF_DBL *pRVar12;
  char *pcVar13;
  long lVar14;
  long lVar15;
  REF_DBL state [5];
  REF_DBL conserved [5];
  REF_STATUS local_bc;
  REF_DBL *local_b8;
  REF_DBL local_88;
  REF_DBL RStack_80;
  REF_DBL local_78;
  REF_DBL RStack_70;
  REF_DBL local_68;
  REF_DBL local_58 [5];
  
  pRVar3 = ref_grid->node;
  iVar9 = pRVar3->max;
  if ((long)iVar9 < 0) {
    hessian = (REF_DBL *)0x0;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0xc31,
           "ref_metric_cons_assembly");
    __size = 1;
  }
  else {
    __size = (long)iVar9 * 8;
    local_b8 = (REF_DBL *)malloc(__size);
    if (local_b8 == (REF_DBL *)0x0) {
      local_b8 = (REF_DBL *)0x0;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0xc31,"ref_metric_cons_assembly");
      __size = 2;
      hessian = (REF_DBL *)0x0;
    }
    else {
      hessian = (REF_DBL *)CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
      if (iVar9 != 0) {
        memset(local_b8,0,__size);
      }
    }
  }
  local_bc = (REF_STATUS)__size;
  if ((char)hessian != '\0') {
    uVar6 = pRVar3->max;
    if ((int)uVar6 < 0) {
      bVar5 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0xc32,"ref_metric_cons_assembly");
      local_bc = 1;
    }
    else {
      hessian = (REF_DBL *)malloc((ulong)uVar6 * 0x30);
      if (hessian == (REF_DBL *)0x0) {
        hessian = (REF_DBL *)0x0;
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0xc32,"ref_metric_cons_assembly");
        local_bc = 2;
        bVar5 = false;
      }
      else {
        bVar5 = true;
        if ((ulong)uVar6 != 0) {
          uVar7 = 1;
          if (1 < (int)(uVar6 * 6)) {
            uVar7 = (ulong)(uVar6 * 6);
          }
          memset(hessian,0,uVar7 << 3);
        }
      }
    }
    if (bVar5) {
      lVar15 = 0;
      do {
        if (0 < pRVar3->max) {
          iVar9 = 0;
          lVar10 = 0;
          do {
            if (-1 < pRVar3->global[lVar10]) {
              local_68 = prim_dual[(long)iVar9 + 4];
              local_88 = prim_dual[iVar9];
              RStack_80 = (prim_dual + iVar9)[1];
              local_78 = prim_dual[(long)iVar9 + 2];
              RStack_70 = (prim_dual + (long)iVar9 + 2)[1];
              uVar6 = ref_phys_make_conserved(&local_88,local_58);
              if (uVar6 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0xc39,"ref_metric_cons_assembly",(ulong)uVar6,"prim2cons");
                return uVar6;
              }
              local_b8[lVar10] = local_58[lVar15];
            }
            lVar10 = lVar10 + 1;
            iVar9 = iVar9 + ldim;
          } while (lVar10 < pRVar3->max);
        }
        uVar6 = ref_recon_hessian(ref_grid,local_b8,hessian,reconstruction);
        if (uVar6 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0xc3c,"ref_metric_cons_assembly",(ulong)uVar6,"hess");
          return uVar6;
        }
        iVar9 = pRVar3->max;
        if (0 < (long)iVar9) {
          pRVar4 = pRVar3->global;
          lVar10 = 0;
          pRVar11 = hessian;
          pRVar12 = metric;
          do {
            if (-1 < pRVar4[lVar10]) {
              lVar14 = 0;
              do {
                dVar1 = g[lVar15 + lVar10 * 5];
                if (dVar1 <= -dVar1) {
                  dVar1 = -dVar1;
                }
                dVar2 = pRVar11[lVar14];
                dVar1 = dVar1 * dVar2 + pRVar12[lVar14];
                pRVar12[lVar14] = dVar1;
                if (0x7fefffffffffffff < (ulong)ABS(g[lVar15 + lVar10 * 5])) {
                  pcVar13 = "g not finite";
                  uVar8 = 0xc41;
LAB_001a0c86:
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                         ,uVar8,"ref_metric_cons_assembly",pcVar13);
                  return 1;
                }
                if (0x7fefffffffffffff < (ulong)ABS(dVar2)) {
                  pcVar13 = "hess not finite";
                  uVar8 = 0xc42;
                  goto LAB_001a0c86;
                }
                if (0x7fefffffffffffff < (long)ABS(dVar1)) {
                  pcVar13 = "metric not finite";
                  uVar8 = 0xc43;
                  goto LAB_001a0c86;
                }
                lVar14 = lVar14 + 1;
              } while (lVar14 != 6);
            }
            lVar10 = lVar10 + 1;
            pRVar12 = pRVar12 + 6;
            pRVar11 = pRVar11 + 6;
          } while (lVar10 != iVar9);
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != 5);
      if (hessian != (REF_DBL *)0x0) {
        free(hessian);
      }
      local_bc = 0;
      if (local_b8 != (REF_DBL *)0x0) {
        free(local_b8);
      }
    }
  }
  return local_bc;
}

Assistant:

REF_FCN REF_STATUS ref_metric_cons_assembly(
    REF_DBL *metric, REF_DBL *g, REF_GRID ref_grid, REF_INT ldim,
    REF_DBL *prim_dual, REF_RECON_RECONSTRUCTION reconstruction) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT var, node, i;
  REF_DBL state[5], conserved[5];
  REF_DBL *cons, *hess_cons;

  ref_malloc_init(cons, ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(hess_cons, 6 * ref_node_max(ref_node), REF_DBL, 0.0);

  for (var = 0; var < 5; var++) {
    each_ref_node_valid_node(ref_node, node) {
      for (i = 0; i < 5; i++) {
        state[i] = prim_dual[i + ldim * node];
      }
      RSS(ref_phys_make_conserved(state, conserved), "prim2cons");
      cons[node] = conserved[var];
    }
    RSS(ref_recon_hessian(ref_grid, cons, hess_cons, reconstruction), "hess");
    each_ref_node_valid_node(ref_node, node) {
      for (i = 0; i < 6; i++) {
        metric[i + 6 * node] +=
            ABS(g[var + 5 * node]) * hess_cons[i + 6 * node];
        RAS(isfinite(ABS(g[var + 5 * node])), "g not finite");
        RAS(isfinite(hess_cons[i + 6 * node]), "hess not finite");
        RAS(isfinite(metric[i + 6 * node]), "metric not finite");
      }
    }
  }

  ref_free(hess_cons);
  ref_free(cons);

  return REF_SUCCESS;
}